

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

RESOURCE_STATE Diligent::VkImageLayoutToResourceState(VkImageLayout Layout)

{
  RESOURCE_STATE RVar1;
  int in_EDI;
  char (*in_R8) [2];
  string msg;
  string local_38;
  char local_14 [4];
  
  RVar1 = RESOURCE_STATE_UNDEFINED;
  if (0x3b9acde9 < in_EDI) {
    if (in_EDI < 0x3b9c9309) {
      if (in_EDI == 0x3b9acdea) {
        return RESOURCE_STATE_PRESENT;
      }
      if (in_EDI == 0x3b9c7b98) {
        FormatString<char[29]>(&local_38,(char (*) [29])"This layout is not supported");
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"VkImageLayoutToResourceState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x5da);
      }
      else {
        if (in_EDI != 0x3b9c9308) goto switchD_00254c18_default;
        FormatString<char[29]>(&local_38,(char (*) [29])"This layout is not supported");
        DebugAssertionFailed
                  (local_38._M_dataplus._M_p,"VkImageLayoutToResourceState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x5d7);
      }
    }
    else {
      if (in_EDI != 0x3b9c9309) {
        if ((in_EDI == 0x3b9d4aa3) || (in_EDI == 0x3b9e1d90)) {
          return RESOURCE_STATE_MAX_BIT;
        }
        goto switchD_00254c18_default;
      }
      FormatString<char[29]>(&local_38,(char (*) [29])"This layout is not supported");
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"VkImageLayoutToResourceState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x5d8);
    }
    goto LAB_00254dad;
  }
  switch(in_EDI) {
  case 0:
    break;
  case 1:
    RVar1 = RESOURCE_STATE_UNORDERED_ACCESS;
    break;
  case 2:
    RVar1 = RESOURCE_STATE_RENDER_TARGET;
    break;
  case 3:
    RVar1 = RESOURCE_STATE_DEPTH_WRITE;
    break;
  case 4:
    RVar1 = RESOURCE_STATE_DEPTH_READ;
    break;
  case 5:
    RVar1 = RESOURCE_STATE_SHADER_RESOURCE;
    break;
  case 6:
    RVar1 = RESOURCE_STATE_COPY_SOURCE;
    break;
  case 7:
    RVar1 = RESOURCE_STATE_COPY_DEST;
    break;
  case 8:
    FormatString<char[29]>(&local_38,(char (*) [29])"This layout is not supported");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VkImageLayoutToResourceState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x5d6);
    goto LAB_00254dad;
  default:
switchD_00254c18_default:
    FormatString<char[23],VkImageLayout,char[2]>
              (&local_38,(Diligent *)"Unknown image layout (",(char (*) [23])local_14,
               (VkImageLayout *)0x920060,in_R8);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"VkImageLayoutToResourceState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x5df);
LAB_00254dad:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return RVar1;
}

Assistant:

RESOURCE_STATE VkImageLayoutToResourceState(VkImageLayout Layout)
{
    static_assert(RESOURCE_STATE_MAX_BIT == (1u << 21), "This function must be updated to handle new resource state flag");
    switch (Layout)
    {
        // clang-format off
        case VK_IMAGE_LAYOUT_UNDEFINED:                                    return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_GENERAL:                                      return RESOURCE_STATE_UNORDERED_ACCESS;
        case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:                     return RESOURCE_STATE_RENDER_TARGET;
        case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:             return RESOURCE_STATE_DEPTH_WRITE;
        case VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL:              return RESOURCE_STATE_DEPTH_READ;
        case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:                     return RESOURCE_STATE_SHADER_RESOURCE;
        case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:                         return RESOURCE_STATE_COPY_SOURCE;
        case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:                         return RESOURCE_STATE_COPY_DEST;
        case VK_IMAGE_LAYOUT_PREINITIALIZED:                               UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_DEPTH_READ_ONLY_STENCIL_ATTACHMENT_OPTIMAL:   UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_DEPTH_ATTACHMENT_STENCIL_READ_ONLY_OPTIMAL:   UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_PRESENT_SRC_KHR:                              return RESOURCE_STATE_PRESENT;
        case VK_IMAGE_LAYOUT_SHARED_PRESENT_KHR:                           UNEXPECTED("This layout is not supported"); return RESOURCE_STATE_UNDEFINED;
        case VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT:
        case VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR: return RESOURCE_STATE_SHADING_RATE;
        // clang-format on
        default:
            UNEXPECTED("Unknown image layout (", Layout, ")");
            return RESOURCE_STATE_UNDEFINED;
    }
}